

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

void __thiscall MinVR::VRDatumInt::~VRDatumInt(VRDatumInt *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>).super_VRDatum_conflict.
  _vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_001291c8;
  p_Var2 = (this->super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>).value.
           super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
  ;
  while (p_Var2 != (_List_node_base *)
                   &(this->super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>).value) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  VRDatum::~VRDatum((VRDatum *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

VRDatumInt(const VRInt inVal) :
    VRDatumSpecialized<VRInt, VRCORETYPE_INT>(inVal) {}